

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PhyloTree.cpp
# Opt level: O2

void __thiscall PhyloTree::PhyloTree(PhyloTree *this,string *t,bool rooted)

{
  vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> *this_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var1;
  pointer pbVar2;
  pointer pPVar3;
  pointer pPVar4;
  _Elt_pointer pPVar5;
  difference_type dVar6;
  difference_type dVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  size_t end;
  iterator iVar11;
  mapped_type *pmVar12;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var13;
  out_of_range *this_01;
  invalid_argument *this_02;
  _Map_pointer ppPVar14;
  long lVar15;
  string *s;
  char cVar16;
  _Elt_pointer pPVar17;
  PhyloTreeEdge *e;
  PhyloTreeEdge *pPVar18;
  _Elt_pointer this_03;
  double dVar19;
  double dVar20;
  reference rVar21;
  Bipartition local_1a8;
  string length;
  deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_> q;
  unordered_map<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long,_BitsetHash,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>_>
  hashmap;
  undefined1 local_d0 [32];
  string label;
  string local_90;
  string local_70;
  string local_50;
  
  (this->newick)._M_dataplus._M_p = (pointer)&(this->newick).field_2;
  (this->newick)._M_string_length = 0;
  (this->newick).field_2._M_local_buf[0] = '\0';
  this_00 = &this->edges;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leaf2NumMap).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_current = (t->_M_dataplus)._M_p;
  q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.super__Deque_impl_data.
  _M_map._0_1_ = 0x28;
  dVar6 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var1._M_current + t->_M_string_length),
                     (_Iter_equals_val<const_char>)&q);
  _Var1._M_current = (t->_M_dataplus)._M_p;
  hashmap._M_h._M_buckets = (__buckets_ptr)CONCAT71(hashmap._M_h._M_buckets._1_7_,0x29);
  dVar7 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    (_Var1,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(_Var1._M_current + t->_M_string_length),
                     (_Iter_equals_val<const_char>)&hashmap);
  if (dVar6 != dVar7) {
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&q,
                   "Bracket mismatch error in tree: ",t);
    std::invalid_argument::invalid_argument(this_02,(string *)&q);
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::_Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::_Deque_base
            (&q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>);
  label._M_dataplus._M_p = (pointer)&label.field_2;
  label._M_string_length = 0;
  label.field_2._M_local_buf[0] = '\0';
  length._M_dataplus._M_p = (pointer)&length.field_2;
  length._M_string_length = 0;
  length.field_2._M_local_buf[0] = '\0';
  cVar16 = (char)t;
  std::__cxx11::string::find(cVar16,0x28);
  std::__cxx11::string::substr((ulong)&hashmap,(ulong)t);
  std::__cxx11::string::operator=((string *)t,(string *)&hashmap);
  std::__cxx11::string::~string((string *)&hashmap);
  s = t;
  std::__cxx11::string::_M_assign((string *)this);
  Tools::despace((Tools *)t,s);
  setLeaf2NumMapFromNewick(this,t);
  std::__cxx11::string::find(cVar16,0x28);
  std::__cxx11::string::substr((ulong)&hashmap,(ulong)t);
  std::__cxx11::string::operator=((string *)t,(string *)&hashmap);
  std::__cxx11::string::~string((string *)&hashmap);
  uVar8 = std::__cxx11::string::rfind(cVar16,0x29);
  std::__cxx11::string::erase((ulong)t,uVar8);
  std::__cxx11::string::_M_assign((string *)t);
  hashmap._M_h._M_buckets = &hashmap._M_h._M_single_bucket;
  hashmap._M_h._M_bucket_count = 1;
  hashmap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  hashmap._M_h._M_element_count = 0;
  hashmap._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  hashmap._M_h._M_rehash_policy._M_next_resize = 0;
  hashmap._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_1a8,
             (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->leaf2NumMap).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)local_d0);
  std::vector<double,_std::allocator<double>_>::_M_move_assign(&this->leafEdgeLengths,&local_1a8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            ((_Vector_base<double,_std::allocator<double>_> *)&local_1a8);
  uVar8 = 0;
  do {
    while( true ) {
      if (t->_M_string_length <= uVar8) {
        lVar15 = 0;
        for (uVar8 = 0;
            pPVar3 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                     ._M_impl.super__Vector_impl_data._M_start,
            uVar8 < (ulong)(((long)(this->edges).
                                   super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0x48
                           ); uVar8 = uVar8 + 1) {
          pPVar18 = (PhyloTreeEdge *)((long)&(pPVar3->super_Bipartition)._vptr_Bipartition + lVar15)
          ;
          PhyloTreeEdge::asSplit(&local_1a8,pPVar18);
          std::make_shared<Bipartition,Bipartition>((Bipartition *)local_d0);
          PhyloTreeEdge::setOriginalEdge(pPVar18,(shared_ptr<Bipartition> *)local_d0);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_d0 + 8));
          Bipartition::~Bipartition(&local_1a8);
          PhyloTreeEdge::setOriginalID
                    ((PhyloTreeEdge *)
                     ((long)&(((this_00->
                               super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                               _M_impl.super__Vector_impl_data._M_start)->super_Bipartition).
                             _vptr_Bipartition + lVar15),(int)uVar8);
          lVar15 = lVar15 + 0x48;
        }
        std::
        _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&hashmap._M_h);
        std::__cxx11::string::~string((string *)&length);
        std::__cxx11::string::~string((string *)&label);
        std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::~deque(&q);
        return;
      }
      pcVar9 = (char *)std::__cxx11::string::at((ulong)t);
      cVar16 = *pcVar9;
      if (cVar16 != '(') break;
      local_1a8._vptr_Bipartition =
           (_func_int **)
           ((long)&local_1a8.partition.m_bits.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data + 8);
      std::__cxx11::string::_M_construct
                ((ulong)&local_1a8,
                 (char)((long)(this->leaf2NumMap).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->leaf2NumMap).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5));
      std::deque<PhyloTreeEdge,std::allocator<PhyloTreeEdge>>::emplace_front<std::__cxx11::string>
                ((deque<PhyloTreeEdge,std::allocator<PhyloTreeEdge>> *)&q,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
LAB_001275fa:
      uVar8 = uVar8 + 1;
    }
    if (cVar16 == ')') {
      sVar10 = Tools::nextIndex(t,uVar8 + 2,",)");
      if ((t->_M_dataplus)._M_p[uVar8 + 1] == ':') {
        std::__cxx11::string::string((string *)&local_50,(string *)t);
        Tools::substring((string *)&local_1a8,&local_50,uVar8 + 2,sVar10);
        std::__cxx11::string::operator=((string *)&length,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::__cxx11::string::operator=((string *)&length,'\0');
      }
      pPVar17 = q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      dVar20 = std::__cxx11::stod(&length,(size_t *)0x0);
      PhyloTreeEdge::setAttribute(pPVar17,dVar20);
      if (rooted) {
LAB_00127879:
        std::vector<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::push_back
                  (this_00,q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_cur);
      }
      else {
        rVar21 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           (&((q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                               _M_impl.super__Deque_impl_data._M_start._M_cur)->super_Bipartition).
                             partition,0);
        if ((*rVar21.m_block & rVar21.m_mask) != 0) {
          boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::flip
                    (&((q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                        super__Deque_impl_data._M_start._M_cur)->super_Bipartition).partition);
        }
        iVar11 = std::
                 _Hashtable<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&hashmap._M_h,
                        &((q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                           _M_impl.super__Deque_impl_data._M_start._M_cur)->super_Bipartition).
                         partition);
        if (iVar11.
            super__Node_iterator_base<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_true>
            ._M_cur == (__node_type *)0x0) {
          pPVar3 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pPVar4 = (this->edges).super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pmVar12 = std::__detail::
                    _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                    ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                  *)&hashmap,
                                 &((q.
                                    super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                    ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                  super_Bipartition).partition);
          *pmVar12 = ((long)pPVar4 - (long)pPVar3) / 0x48;
          goto LAB_00127879;
        }
        pmVar12 = std::__detail::
                  _Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>,_std::allocator<std::pair<const_boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>,_BitsetHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&hashmap,
                               &((q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>
                                  ._M_impl.super__Deque_impl_data._M_start._M_cur)->
                                super_Bipartition).partition);
        pPVar18 = (this_00->super__Vector_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>).
                  _M_impl.super__Vector_impl_data._M_start + *pmVar12;
        dVar20 = (q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur)->length;
        dVar19 = PhyloTreeEdge::getLength(pPVar18);
        PhyloTreeEdge::setAttribute(pPVar18,dVar20 + dVar19);
      }
      std::deque<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>::pop_front(&q);
      uVar8 = sVar10;
    }
    else {
      if (cVar16 == ',') goto LAB_001275fa;
      sVar10 = Tools::nextIndex(t,uVar8,":");
      end = Tools::nextIndex(t,uVar8," ,()");
      if (end < sVar10) {
        std::__cxx11::string::operator=((string *)&length,'\0');
        sVar10 = end;
      }
      else {
        end = Tools::nextIndex(t,sVar10," ,)");
        std::__cxx11::string::string((string *)&local_70,(string *)t);
        Tools::substring((string *)&local_1a8,&local_70,sVar10 + 1,end);
        std::__cxx11::string::operator=((string *)&length,(string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        std::__cxx11::string::~string((string *)&local_70);
      }
      std::__cxx11::string::string((string *)&local_90,(string *)t);
      Tools::substring((string *)&local_1a8,&local_90,uVar8,sVar10);
      std::__cxx11::string::operator=((string *)&label,(string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::__cxx11::string::~string((string *)&local_90);
      _Var13 = std::
               __lower_bound<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,__gnu_cxx::__ops::_Iter_less_val>
                         ((this->leaf2NumMap).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (this->leaf2NumMap).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish,&label);
      pbVar2 = (this->leaf2NumMap).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar10 = (size_t)(int)((ulong)((long)_Var13._M_current - (long)pbVar2) >> 5);
      if (sVar10 == (long)(this->leaf2NumMap).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5) {
        this_01 = (out_of_range *)__cxa_allocate_exception(0x10);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,"Could not find label (",&label);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
                       ,") in leaf2NumMap");
        std::out_of_range::out_of_range(this_01,(string *)&local_1a8);
        __cxa_throw(this_01,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
      }
      dVar20 = std::__cxx11::stod(&length,(size_t *)0x0);
      pPVar5 = q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
               super__Deque_impl_data._M_finish._M_cur;
      (this->leafEdgeLengths).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[sVar10] = dVar20;
      ppPVar14 = q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                 super__Deque_impl_data._M_start._M_node;
      pPVar17 = q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Deque_impl_data._M_start._M_last;
      this_03 = q.super__Deque_base<PhyloTreeEdge,_std::allocator<PhyloTreeEdge>_>._M_impl.
                super__Deque_impl_data._M_start._M_cur;
      while (uVar8 = end, this_03 != pPVar5) {
        Bipartition::addOne(&this_03->super_Bipartition,sVar10);
        this_03 = this_03 + 1;
        if (this_03 == pPVar17) {
          this_03 = ppPVar14[1];
          ppPVar14 = ppPVar14 + 1;
          pPVar17 = this_03 + 7;
        }
      }
    }
  } while( true );
}

Assistant:

PhyloTree::PhyloTree(string t, bool rooted) {
    // do bracket counting sanity check
    if (count(t.begin(), t.end(), '(') != count(t.begin(), t.end(), ')')) {
        throw invalid_argument("Bracket mismatch error in tree: " + t);
    }

    int leafNum = 0;
    deque<PhyloTreeEdge> q;
    string label, length;
    size_t i = 0;

    // remove anything before the first (
    t = t.substr(t.find_first_of('('));
    newick = t;

    // remove whitespace
    Tools::despace(t);
    setLeaf2NumMapFromNewick(t);
    //pull off ';' if at end
//    t = t.erase(t.find_last_of(";"));

    // pull off the first and last brackets (and a root length, between the last bracket and ;, if there is one.
    t = t.substr(t.find_first_of('(') + 1);
    t = t.erase(t.find_last_of(')'));

    std::unordered_map<bitset_t, size_t, BitsetHash> hashmap; // Maintain store of edges keyed by bitset, value is index of edges[index]
    try {
        size_t end_of_label, end_of_length, alt_end_of_label;
        leafEdgeLengths = vector<double>(leaf2NumMap.size());
        size_t lastLeaf = leaf2NumMap.size();
        while (i < t.size()) {
            switch (t.at(i)) {
                case '(': {
                    q.emplace_front(string(leaf2NumMap.size(), '0'));
                    i++;
                    break;
                }

                case ')': {
                    end_of_length = Tools::nextIndex(t, i + 2, ",)");
                    if (t[i + 1] == ':') {
                        length = Tools::substring(t, i + 2, end_of_length);
                    }
                    else {
                        length = LENGTH_DEFAULT;
                    }
                    q.front().setAttribute(stod(length));

                    if (!rooted) {
                        if (q.front().partition[0]) {
                            q.front().partition.flip();
                        }
                        if (hashmap.find(q.front().partition) == hashmap.end()) {  // never before seen edge
                            hashmap[q.front().partition] = edges.size();
                            edges.push_back(q.front());
                        }
                        else {
                            size_t index = hashmap[q.front().partition];
                            edges[index].setAttribute(q.front().length + edges[index].getLength());
                        }
                    }
                    else {
                        edges.push_back(q.front());
                    }
                    q.pop_front();
                    i = end_of_length;
                    break;
                }

                case ',': {
                    i++;
                    break;
                }

                    // this char is the beginning of a leaf name
                default: {
                    end_of_label = Tools::nextIndex(t, i, ":");

                    // check if 'correct' :-delimited length is missing
                    alt_end_of_label = Tools::nextIndex(t, i, " ,()");
                    if (alt_end_of_label < end_of_label) {
                        end_of_label = end_of_length = alt_end_of_label;
                        length = LENGTH_DEFAULT;
                    }
                    else {
                        end_of_length = Tools::nextIndex(t, end_of_label, " ,)");
                        length = Tools::substring(t, end_of_label + 1, end_of_length);
                    }
                    label = Tools::substring(t, i, end_of_label);
                    leafNum = lower_bound(leaf2NumMap.begin(), leaf2NumMap.end(), label) - leaf2NumMap.begin();
                    if (leafNum == leaf2NumMap.size()) throw out_of_range("Could not find label (" + label + ") in leaf2NumMap");
                    leafEdgeLengths[leafNum] = stod(length);

                    for (auto &e: q) {
                        e.addOne((size_t) leafNum);
                    }
                    i = end_of_length;
                }
            }
        }
    }
    catch (out_of_range &range_err) {
        throw range_err;
    }

//    if (!rooted) {
//        size_t lastLeaf = leaf2NumMap.size() - 1;
//        for (auto &e : edges) {
//            if (e.contains(lastLeaf)) {
//                e.complement(lastLeaf + 1);
//            }
//        }
//    }

    for (size_t k = 0; k < edges.size(); ++k) {
        edges[k].setOriginalEdge(make_shared<Bipartition>(edges[k].asSplit()));
        edges[k].setOriginalID((int) k);
    }
}